

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::SegmentInfo::~SegmentInfo(SegmentInfo *this)

{
  long in_RDI;
  
  if (*(void **)(in_RDI + 0x38) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x38));
  }
  *(undefined8 *)(in_RDI + 0x38) = 0;
  if (*(void **)(in_RDI + 0x40) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x40));
  }
  *(undefined8 *)(in_RDI + 0x40) = 0;
  if (*(void **)(in_RDI + 0x48) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x48));
  }
  *(undefined8 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

SegmentInfo::~SegmentInfo() {
  delete[] m_pMuxingAppAsUTF8;
  m_pMuxingAppAsUTF8 = NULL;

  delete[] m_pWritingAppAsUTF8;
  m_pWritingAppAsUTF8 = NULL;

  delete[] m_pTitleAsUTF8;
  m_pTitleAsUTF8 = NULL;
}